

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall tetgenmesh::suppresssteinerpoints(tetgenmesh *this)

{
  arraypool *paVar1;
  point searchpt;
  long lVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  tetgenbehavior *ptVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  tetgenmesh *this_00;
  int iVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double local_88;
  optparameters local_68;
  
  ptVar6 = this->b;
  if (ptVar6->quiet == 0) {
    puts("Suppressing Steiner points ...");
    ptVar6 = this->b;
  }
  iVar10 = ptVar6->fliplinklevel;
  ptVar6->fliplinklevel = 100000;
  uVar7 = 0;
  for (lVar12 = 0; paVar1 = this->subvertstack, lVar12 < paVar1->objects; lVar12 = lVar12 + 1) {
    if ((*(uint *)((long)*(point *)(paVar1->toparray
                                    [(uint)lVar12 >> ((byte)paVar1->log2objectsperblock & 0x1f)] +
                                   (long)paVar1->objectbytes *
                                   (long)(int)(paVar1->objectsperblockmark & (uint)lVar12)) +
                  (long)this->pointmarkindex * 4 + 4) & 0xfffffe00) == 0x600) {
      iVar5 = suppressbdrysteinerpoint
                        (this,*(point *)(paVar1->toparray
                                         [(uint)lVar12 >> ((byte)paVar1->log2objectsperblock & 0x1f)
                                         ] + (long)paVar1->objectbytes *
                                             (long)(int)(paVar1->objectsperblockmark & (uint)lVar12)
                                        ));
      uVar7 = uVar7 + iVar5;
    }
  }
  ptVar6 = this->b;
  if ((0 < (int)uVar7) && (ptVar6->verbose != 0)) {
    printf("  Suppressed %d boundary Steiner points.\n",(ulong)uVar7);
    ptVar6 = this->b;
  }
  if (0 < ptVar6->supsteiner_level) {
    uVar7 = 0;
    for (lVar12 = 0; paVar1 = this->subvertstack, lVar12 < paVar1->objects; lVar12 = lVar12 + 1) {
      if ((*(uint *)((long)*(point *)(paVar1->toparray
                                      [(uint)lVar12 >> ((byte)paVar1->log2objectsperblock & 0x1f)] +
                                     (long)paVar1->objectbytes *
                                     (long)(int)(paVar1->objectsperblockmark & (uint)lVar12)) +
                    (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0x800) {
        iVar5 = removevertexbyflips(this,*(point *)(paVar1->toparray
                                                    [(uint)lVar12 >>
                                                     ((byte)paVar1->log2objectsperblock & 0x1f)] +
                                                   (long)paVar1->objectbytes *
                                                   (long)(int)(paVar1->objectsperblockmark &
                                                              (uint)lVar12)));
        uVar7 = uVar7 + iVar5;
      }
    }
    ptVar6 = this->b;
    if ((0 < (int)uVar7) && (ptVar6->verbose != 0)) {
      printf("  Removed %d interior Steiner points.\n",(ulong)uVar7);
      ptVar6 = this->b;
    }
  }
  ptVar6->fliplinklevel = iVar10;
  if (1 < ptVar6->supsteiner_level) {
    local_68.min_max_dihedangle = 0;
    local_68.initval = 0.0;
    local_68.imprval = 0.0;
    local_68.smthiter = 0;
    local_68.max_min_volume = 1;
    local_68.min_max_aspectratio = 0;
    uVar14 = 0xd2f1a9fc;
    uVar15 = 0x3f50624d;
    uVar7 = 0;
    iVar10 = 0x14;
    iVar5 = 0x1e;
    do {
      local_68.maxiter = iVar5;
      local_68.numofsearchdirs = iVar10;
      local_68.searchstep = (double)CONCAT44(uVar15,uVar14);
      uVar4 = 0;
      do {
        iVar10 = 0;
        iVar9 = 0;
        for (lVar12 = 0; paVar1 = this->subvertstack, lVar12 < paVar1->objects; lVar12 = lVar12 + 1)
        {
          searchpt = *(point *)(paVar1->toparray
                                [(uint)lVar12 >> ((byte)paVar1->log2objectsperblock & 0x1f)] +
                               (long)paVar1->objectbytes *
                               (long)(int)(paVar1->objectsperblockmark & (uint)lVar12));
          if ((*(uint *)((long)searchpt + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0x800
             ) {
            this_00 = this;
            getvertexstar(this,1,searchpt,this->cavetetlist,(arraypool *)0x0,(arraypool *)0x0);
            paVar1 = this->cavetetlist;
            lVar8 = paVar1->objects;
            local_88 = local_68.initval;
            if (lVar8 < 1) {
              lVar8 = 0;
            }
            for (lVar11 = 0; lVar8 != lVar11; lVar11 = lVar11 + 1) {
              lVar2 = *(long *)(paVar1->toparray
                                [(uint)lVar11 >> ((byte)paVar1->log2objectsperblock & 0x1f)] +
                               (long)paVar1->objectbytes *
                               (long)(int)(paVar1->objectsperblockmark & (uint)lVar11));
              dVar3 = orient3dfast(this_00,*(double **)(lVar2 + 0x28),*(double **)(lVar2 + 0x20),
                                   *(double **)(lVar2 + 0x30),*(double **)(lVar2 + 0x38));
              if ((lVar11 == 0) || (dVar3 < local_88)) {
                local_88 = dVar3;
              }
            }
            local_68.initval = local_88;
            iVar5 = smoothpoint(this,searchpt,paVar1,1,&local_68);
            iVar10 = (iVar10 + 1) - (uint)(iVar5 == 0);
            iVar9 = (iVar9 + 1) - (uint)(0.0 < local_68.imprval);
            this->cavetetlist->objects = 0;
          }
        }
        uVar7 = uVar7 + iVar10;
      } while ((iVar10 != 0) && (bVar13 = uVar4 < 2, uVar4 = uVar4 + 1, bVar13));
      if (iVar9 < 1) break;
      uVar14 = 0xeb1c432d;
      uVar15 = 0x3f1a36e2;
      iVar10 = 0x1e;
      iVar5 = -1;
    } while (0 < local_68.maxiter);
    if (0 < iVar9) {
      puts("BUG Report!  The mesh contain inverted elements.");
    }
    if ((this->b->verbose != 0) && (0 < (int)uVar7)) {
      printf("  Smoothed %d Steiner points.\n",(ulong)uVar7);
    }
  }
  this->subvertstack->objects = 0;
  return 1;
}

Assistant:

int tetgenmesh::suppresssteinerpoints()
{

  if (!b->quiet) {
    printf("Suppressing Steiner points ...\n");
  }

  point rempt, *parypt;

  int bak_fliplinklevel = b->fliplinklevel;
  b->fliplinklevel = 100000; // Unlimited flip level.
  int suppcount = 0, remcount = 0;
  int i;

  // Try to suppress boundary Steiner points.
  for (i = 0; i < subvertstack->objects; i++) {
    parypt = (point *) fastlookup(subvertstack, i);
    rempt = *parypt;
    if (pointtype(rempt) != UNUSEDVERTEX) {
      if ((pointtype(rempt) == FREESEGVERTEX) || 
          (pointtype(rempt) == FREEFACETVERTEX)) {
        if (suppressbdrysteinerpoint(rempt)) {
          suppcount++;
        }
      }
    }
  } // i

  if (suppcount > 0) {
    if (b->verbose) {
      printf("  Suppressed %d boundary Steiner points.\n", suppcount);
    }
  }

  if (b->supsteiner_level > 0) { // -Y/1
    for (i = 0; i < subvertstack->objects; i++) {
      parypt = (point *) fastlookup(subvertstack, i);
      rempt = *parypt;
      if (pointtype(rempt) != UNUSEDVERTEX) {
        if (pointtype(rempt) == FREEVOLVERTEX) {
          if (removevertexbyflips(rempt)) {
            remcount++;
          }
        }
      }
    }
  }

  if (remcount > 0) {
    if (b->verbose) {
      printf("  Removed %d interior Steiner points.\n", remcount);
    }
  }

  b->fliplinklevel = bak_fliplinklevel;

  if (b->supsteiner_level > 1) { // -Y/2
    // Smooth interior Steiner points.
    optparameters opm;
    triface *parytet;
    point *ppt;
    REAL ori;
    int smtcount, count, ivcount;
    int nt, j;

    // Point smooth options.
    opm.max_min_volume = 1;
    opm.numofsearchdirs = 20;
    opm.searchstep = 0.001;
    opm.maxiter = 30; // Limit the maximum iterations.

    smtcount = 0;

    do {

      nt = 0;

      while (1) {
        count = 0;
        ivcount = 0; // Clear the inverted count.

        for (i = 0; i < subvertstack->objects; i++) {
          parypt = (point *) fastlookup(subvertstack, i);
          rempt = *parypt;
          if (pointtype(rempt) == FREEVOLVERTEX) {
            getvertexstar(1, rempt, cavetetlist, NULL, NULL);
            // Calculate the initial smallest volume (maybe zero or negative).
            for (j = 0; j < cavetetlist->objects; j++) {
              parytet = (triface *) fastlookup(cavetetlist, j);
              ppt = (point *) &(parytet->tet[4]);
              ori = orient3dfast(ppt[1], ppt[0], ppt[2], ppt[3]);
              if (j == 0) {
                opm.initval = ori;
              } else {
                if (opm.initval > ori) opm.initval = ori; 
              }
            }
            if (smoothpoint(rempt, cavetetlist, 1, &opm)) {
              count++;
            }
            if (opm.imprval <= 0.0) {
              ivcount++; // The mesh contains inverted elements.
            }
            cavetetlist->restart();
          }
        } // i

        smtcount += count;

        if (count == 0) {
          // No point has been smoothed.
          break;
        }

        nt++;
        if (nt > 2) {
          break; // Already three iterations.
        }
      } // while

      if (ivcount > 0) {
        // There are inverted elements!
        if (opm.maxiter > 0) {
          // Set unlimited smoothing steps. Try again.
          opm.numofsearchdirs = 30;
          opm.searchstep = 0.0001;
          opm.maxiter = -1;
          continue;
        }
      }

      break;
    } while (1); // Additional loop for (ivcount > 0)

    if (ivcount > 0) {
      printf("BUG Report!  The mesh contain inverted elements.\n");
    }

    if (b->verbose) {
      if (smtcount > 0) {
        printf("  Smoothed %d Steiner points.\n", smtcount); 
      }
    }
  } // -Y2

  subvertstack->restart();

  return 1;
}